

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalcrules.cpp
# Opt level: O1

void __thiscall fmcalc::init_profile(fmcalc *this)

{
  char *pcVar1;
  long *plVar2;
  FILE *__stream;
  size_t sVar3;
  undefined8 extraout_RAX;
  pointer *ppvVar4;
  string file;
  fm_profile f;
  fm_profile d;
  undefined1 local_98 [32];
  undefined1 local_78 [16];
  pointer local_68;
  pointer pvStack_60;
  pointer local_58;
  undefined1 local_48 [16];
  int local_38 [4];
  pointer local_28;
  
  pcVar1 = local_98 + 0x10;
  local_98._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"input/fm_profile.bin","");
  if ((this->inputpath_)._M_string_length != 0) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)local_98);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_48,0,(char *)0x0,
                                (ulong)(this->inputpath_)._M_dataplus._M_p);
    ppvVar4 = (pointer *)(plVar2 + 2);
    if ((pointer *)*plVar2 == ppvVar4) {
      local_68 = *ppvVar4;
      pvStack_60 = (pointer)plVar2[3];
      local_78._0_8_ = &local_68;
    }
    else {
      local_68 = *ppvVar4;
      local_78._0_8_ = (pointer *)*plVar2;
    }
    local_78._8_8_ = plVar2[1];
    *plVar2 = (long)ppvVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)local_98,(string *)local_78);
    if ((pointer *)local_78._0_8_ != &local_68) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((int *)local_48._0_8_ != local_38) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  __stream = fopen((char *)local_98._0_8_,"rb");
  if (__stream != (FILE *)0x0) {
    local_68 = (pointer)0x0;
    pvStack_60 = (pointer)0x0;
    local_78._0_4_ = 0;
    local_78._4_4_ = 0;
    local_78._8_4_ = 0.0;
    local_78._12_4_ = 0.0;
    local_58 = (pointer)0x0;
    sVar3 = fread(local_78,0x28,1,__stream);
    if ((int)sVar3 != 0) {
      do {
        init_profile_rec(this,(fm_profile *)local_78);
        if (this->noop_profile_id < (int)local_78._0_4_) {
          this->noop_profile_id = local_78._0_4_;
        }
        sVar3 = fread((fm_profile *)local_78,0x28,1,__stream);
      } while ((int)sVar3 != 0);
    }
    local_48._0_4_ = this->noop_profile_id + 1;
    this->noop_profile_id = local_48._0_4_;
    local_48._8_8_ = (pointer)0x0;
    local_38[0] = 0;
    local_38[1] = 0;
    local_38[2] = 0;
    local_38[3] = 0;
    local_28 = (pointer)0x0;
    local_48._4_4_ = 100;
    init_profile_rec(this,(fm_profile *)local_48);
    fclose(__stream);
    if ((char *)local_98._0_8_ != pcVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    return;
  }
  init_profile((fmcalc *)local_98);
  if ((int *)local_48._0_8_ != local_38) {
    operator_delete((void *)local_48._0_8_);
  }
  if ((char *)local_98._0_8_ != pcVar1) {
    operator_delete((void *)local_98._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void fmcalc::init_profile()
{
	FILE *fin = NULL;
	std::string file = FMPROFILE_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "%s: cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}
	fm_profile f;
	int i = fread(&f, sizeof(f), 1, fin);
	while (i != 0) {		
		init_profile_rec(f);
		if (noop_profile_id < f.profile_id) noop_profile_id = f.profile_id;
		i = fread(&f, sizeof(f), 1, fin);
	}
	noop_profile_id++;
	fm_profile d;	// dummy
	d.profile_id = noop_profile_id;
	//d.calcrule_id = 14;
	d.calcrule_id = 100; // noop
	init_profile_rec(d);
	fclose(fin);
}